

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O2

void __thiscall
Js::JavascriptPromiseAllSettledResolveOrRejectElementFunction::ExtractSnapObjectDataInto
          (JavascriptPromiseAllSettledResolveOrRejectElementFunction *this,SnapObject *objData,
          SlabAllocator *alloc)

{
  JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *pJVar1;
  uint dependsOnArrayCount;
  SnapPromiseAllResolveElementFunctionInfo *addtlInfo;
  unsigned_long *dependsOnArray;
  Type *pTVar2;
  ulong count;
  uint32 i;
  ulong uVar3;
  undefined1 local_70 [8];
  List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> depOnList
  ;
  
  depOnList._40_8_ = objData;
  addtlInfo = (SnapPromiseAllResolveElementFunctionInfo *)
              TTD::SlabAllocatorBase<0>::SlabAllocateTypeRawSize<72ul>(alloc);
  depOnList.super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>._16_8_ =
       &Memory::HeapAllocator::Instance;
  local_70 = (undefined1  [8])&PTR_IsReadOnly_013cc0d0;
  depOnList.super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>.
  _vptr_ReadOnlyList = (_func_int **)0x0;
  depOnList.super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>.buffer._0_4_ =
       0;
  depOnList.super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>.alloc =
       (Type)0x400000000;
  JavascriptPromiseCapability::ExtractSnapPromiseCapabilityInto
            ((this->super_JavascriptPromiseAllResolveElementFunction).capabilities.ptr,
             (SnapPromiseCapabilityInfo *)addtlInfo,
             (List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              *)local_70,(SlabAllocator *)&PTR_IsReadOnly_013cc0d0);
  addtlInfo->Index = (this->super_JavascriptPromiseAllResolveElementFunction).index;
  pJVar1 = (this->super_JavascriptPromiseAllResolveElementFunction).remainingElementsWrapper.ptr;
  addtlInfo->RemainingElementsWrapperId = (TTD_PTR_ID)pJVar1;
  addtlInfo->RemainingElementsValue = pJVar1->remainingElements;
  addtlInfo->Values =
       (TTD_PTR_ID)(this->super_JavascriptPromiseAllResolveElementFunction).values.ptr;
  JsUtil::List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
  Add((List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
      local_70,&addtlInfo->Values);
  dependsOnArrayCount =
       (uint)depOnList.super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>.
             buffer;
  addtlInfo->AlreadyCalled = (this->super_JavascriptPromiseAllResolveElementFunction).alreadyCalled;
  count = (ulong)(uint)depOnList.
                       super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>.
                       buffer;
  dependsOnArray = TTD::SlabAllocatorBase<0>::SlabAllocateArray<unsigned_long>(alloc,count);
  for (uVar3 = 0; count != uVar3; uVar3 = uVar3 + 1) {
    pTVar2 = JsUtil::
             List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::Item((List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                     *)local_70,(int)uVar3);
    dependsOnArray[uVar3] = *pTVar2;
  }
  TTD::NSSnapObjects::
  StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapPromiseAllResolveElementFunctionInfo*,(TTD::NSSnapObjects::SnapObjectType)31>
            ((SnapObject *)depOnList._40_8_,addtlInfo,alloc,dependsOnArrayCount,dependsOnArray);
  JsUtil::List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
  ~List((List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
        local_70);
  return;
}

Assistant:

void JavascriptPromiseAllSettledResolveOrRejectElementFunction::ExtractSnapObjectDataInto(TTD::NSSnapObjects::SnapObject* objData, TTD::SlabAllocator& alloc)
    {
        TTD::NSSnapObjects::SnapPromiseAllResolveElementFunctionInfo* sprai = alloc.SlabAllocateStruct<TTD::NSSnapObjects::SnapPromiseAllResolveElementFunctionInfo>();

        JsUtil::List<TTD_PTR_ID, HeapAllocator> depOnList(&HeapAllocator::Instance);
        this->capabilities->ExtractSnapPromiseCapabilityInto(&sprai->Capabilities, depOnList, alloc);

        sprai->Index = this->index;
        sprai->RemainingElementsWrapperId = TTD_CONVERT_PROMISE_INFO_TO_PTR_ID(this->remainingElementsWrapper);
        sprai->RemainingElementsValue = this->remainingElementsWrapper->remainingElements;

        sprai->Values = TTD_CONVERT_VAR_TO_PTR_ID(this->values);
        depOnList.Add(sprai->Values);

        sprai->AlreadyCalled = this->alreadyCalled;

        uint32 depOnCount = depOnList.Count();
        TTD_PTR_ID* depOnArray = alloc.SlabAllocateArray<TTD_PTR_ID>(depOnCount);

        for (uint32 i = 0; i < depOnCount; ++i)
        {
            depOnArray[i] = depOnList.Item(i);
        }

        TTD::NSSnapObjects::StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapPromiseAllResolveElementFunctionInfo*, TTD::NSSnapObjects::SnapObjectType::SnapPromiseAllResolveElementFunctionObject>(objData, sprai, alloc, depOnCount, depOnArray);
    }